

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::Detail::convertIntoString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,StringRef string)

{
  uint uVar1;
  Context *pCVar2;
  undefined1 in_R8B;
  StringRef string_00;
  
  string_00.m_start = string.m_start;
  pCVar2 = getCurrentContext();
  uVar1 = (*pCVar2->m_config->_vptr_IConfig[10])();
  string_00.m_size._0_4_ = uVar1 & 0xff;
  string_00.m_size._4_4_ = 0;
  convertIntoString_abi_cxx11_(__return_storage_ptr__,this,string_00,(bool)in_R8B);
  return __return_storage_ptr__;
}

Assistant:

std::string convertIntoString(StringRef string) {
        return convertIntoString(string, getCurrentContext().getConfig()->showInvisibles());
    }